

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O1

void squall::detail::check_argument_type<(squall::detail::FetchContext)0>
               (HSQUIRRELVM vm,SQInteger index,SQObjectType t)

{
  SQObjectType SVar1;
  runtime_error *this;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SVar1 = sq_gettype(vm,index);
  if (SVar1 == t) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90 = &local_80;
  local_80 = 0x746e656d75677261;
  local_88 = 8;
  local_78 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_110._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_110._M_dataplus._M_p == psVar3) {
    local_110.field_2._M_allocated_capacity = *psVar3;
    local_110.field_2._8_8_ = plVar2[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar3;
  }
  local_110._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  get_type_text_abi_cxx11_(&local_b0,(squall *)(ulong)t,(SQObjectType)local_110._M_string_length);
  std::operator+(&local_70,&local_110,&local_b0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar3) {
    local_f0.field_2._M_allocated_capacity = *psVar3;
    local_f0.field_2._8_8_ = plVar2[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar3;
  }
  local_f0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  get_type_text_abi_cxx11_(&local_d0,(squall *)(ulong)SVar1,(SQObjectType)local_f0._M_string_length)
  ;
  std::operator+(&local_50,&local_f0,&local_d0);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  *(undefined ***)this = &PTR__runtime_error_0013d368;
  __cxa_throw(this,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_argument_type(HSQUIRRELVM vm, SQInteger index, SQObjectType t) {
    SQObjectType at = sq_gettype(vm, index);
    if (at != t) {
        throw squirrel_error(
            fetch_context_string<FC>() + _SC(" must be ") + get_type_text(t) +
            _SC(", actual value is ") + get_type_text(at));
    }
}